

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

BTLeafNode * __thiscall
storage::BTLeafNode::insert_(BTLeafNode *this,int key,Record *record,bool *out)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  BTLeafNode *pBVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  *out = true;
  iVar2 = (this->super_BTNode).used_links_count_;
  uVar5 = iVar2 - 2;
  if (1 < iVar2) {
    iVar9 = 0;
    uVar10 = uVar5;
    do {
      iVar8 = ((int)(uVar10 - iVar9) >> 1) + iVar9;
      iVar3 = (this->super_BTNode).keys_[iVar8];
      if (iVar3 == key) {
        *out = false;
        return (BTLeafNode *)0x0;
      }
      if (iVar3 == key || iVar3 < key) {
        iVar9 = iVar8 + 1;
      }
      else {
        uVar10 = iVar8 - 1;
      }
    } while (iVar9 <= (int)uVar10);
    if (0x32 < iVar2) {
      pBVar6 = split(this,key,record);
      return pBVar6;
    }
    if (1 < iVar2) {
      lVar7 = (ulong)(iVar2 - 1) + 0x1c;
      do {
        iVar2 = (this->super_BTNode).keys_[uVar5];
        if (iVar2 <= key) goto LAB_00104549;
        (this->super_BTNode).keys_[lVar7 + -0x1c] = iVar2;
        *(Record **)((this->super_BTNode).keys_ + lVar7 * 2 + -5) = this->record_links_[uVar5];
        lVar7 = lVar7 + -1;
        bVar4 = 0 < (int)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar4);
      uVar5 = 0xffffffff;
    }
  }
LAB_00104549:
  (this->super_BTNode).keys_[(long)(int)uVar5 + 1] = key;
  this->record_links_[(long)(int)uVar5 + 1] = record;
  piVar1 = &(this->super_BTNode).used_links_count_;
  *piVar1 = *piVar1 + 1;
  return (BTLeafNode *)0x0;
}

Assistant:

BTLeafNode *BTLeafNode::insert_(int key, Record *record, bool &out) {
        out = true;
        Record *a = nullptr;
        int index = -1;
        if (!search_record(key, a, index)) {
            if (!full()) {
                int i = 0;
                for (i = used_links_count_ - 2; i >= 0; --i) {
                    if (keys_[i] > key) {
                        keys_[i + 1] = keys_[i];
                        record_links_[i + 1] = record_links_[i];
                    } else {
                        break;
                    }
                }
                keys_[i + 1] = key;
                record_links_[i + 1] = record;
                used_links_count_++;
            } else {
                return split(key, record);
            }
        } else {
            out = false;
        }
        return nullptr;
    }